

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

opj_image_t * pnmtoimage(char *filename,opj_cparameters_t *parameters)

{
  undefined8 uVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  FILE *__stream;
  char *pcVar13;
  uchar *start;
  opj_image_t *poVar14;
  size_t sVar15;
  int iVar16;
  OPJ_INT32 OVar17;
  opj_image_cmptparm_t *poVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  pnm_header *out_n;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  size_t sStack_3b0;
  uint local_3a4;
  pnm_header header_info;
  int local_358;
  int iStack_354;
  char type [256];
  opj_image_cmptparm_t cmptparm [4];
  uchar c1;
  char local_137 [263];
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"pnmtoimage:Failed to open %s for reading!\n",filename);
    return (opj_image_t *)0x0;
  }
  header_info.format = 0;
  header_info.rgb = '\0';
  header_info.rgba = '\0';
  header_info.gray = '\0';
  header_info.graya = '\0';
  header_info.bw = '\0';
  header_info.ok = '\0';
  header_info._26_2_ = 0;
  header_info.width = 0;
  header_info.height = 0;
  header_info.maxval = 0;
  header_info.depth = 0;
  pcVar13 = fgets((char *)&c1,0xfa,__stream);
  if (pcVar13 == (char *)0x0) {
    pcVar13 = "\nWARNING: fgets return a NULL value";
    sStack_3b0 = 0x23;
LAB_00106035:
    start = (uchar *)fwrite(pcVar13,sStack_3b0,1,_stderr);
  }
  else {
    if (c1 != 'P') {
      pcVar13 = "read_pnm_header:PNM:magic P missing\n";
      sStack_3b0 = 0x24;
      goto LAB_00106035;
    }
    uVar8 = atoi(local_137);
    if (0xfffffff8 < uVar8 - 8) {
      bVar6 = true;
      header_info.format = uVar8;
LAB_00105c85:
      do {
        do {
          pcVar13 = fgets((char *)&c1,0xfa,__stream);
          iVar9 = header_info.width;
          bVar5 = true;
          if (pcVar13 == (char *)0x0) {
LAB_00105f98:
            bVar27 = (uVar8 & 6) != 2;
            start = (uchar *)(ulong)bVar27;
            if ((((int)uVar8 < 5 && bVar27) ||
                (start = (uchar *)(ulong)(header_info.maxval - 0x10000U),
                0xffff0000 < header_info.maxval - 0x10000U)) &&
               ((0 < header_info.width && (0 < header_info.height)))) {
              if (uVar8 == 7) {
                if (bVar5) {
                  pcVar13 = "read_pnm_header:P7 without ENDHDR\n";
                  sStack_3b0 = 0x22;
                  goto LAB_00106035;
                }
                uVar8 = header_info.depth - 5;
                start = (uchar *)(ulong)CONCAT31((int3)(uVar8 >> 8),uVar8 < 0xfffffffc);
                if (!bVar6 && uVar8 >= 0xfffffffc) {
                  header_info.ok = '\x01';
                }
              }
              else {
                header_info.ok = '\x01';
                if ((uVar8 == 4) || (uVar8 == 1)) {
                  header_info.maxval = 0xff;
                }
              }
            }
            goto LAB_0010605b;
          }
        } while (c1 == '#');
        if (uVar8 != 7) {
          bVar27 = false;
          start = &c1;
          if ((header_info.width == 0) &&
             (((start = (uchar *)skip_int((char *)&c1,&header_info.width), start == (uchar *)0x0 ||
               (*start == '\0')) || (bVar27 = true, header_info.width < 1)))) goto LAB_0010605b;
          if (header_info.height == 0) {
            bVar27 = iVar9 == 0;
            start = (uchar *)skip_int((char *)start,&header_info.height);
            bVar26 = start == (uchar *)0x0;
            if (!bVar26) {
              if ((*start != '\0') && (0 < header_info.height)) {
                if ((uVar8 == 1) || (bVar27 = true, uVar8 == 4)) goto LAB_00105f98;
                goto LAB_00105df0;
              }
              goto LAB_0010605b;
            }
          }
          else {
LAB_00105df0:
            start = (uchar *)skip_int((char *)start,&header_info.maxval);
            bVar26 = start == (uchar *)0x0;
            if (!bVar26) {
              if (*start != '\0') goto LAB_00105f98;
              goto LAB_0010605b;
            }
          }
          if (!(bool)(bVar27 & bVar26)) goto LAB_0010605b;
          goto LAB_00105c85;
        }
        start = (uchar *)skip_idf((char *)&c1,(char *)cmptparm);
        if ((start == (uchar *)0x0) || (*start == '\0')) goto LAB_0010605b;
        iVar9 = bcmp(cmptparm,"ENDHDR",7);
        if (iVar9 == 0) {
          bVar5 = false;
          goto LAB_00105f98;
        }
        iVar9 = bcmp(cmptparm,"WIDTH",6);
        if (iVar9 == 0) {
          out_n = &header_info;
        }
        else {
          iVar9 = bcmp(cmptparm,"HEIGHT",7);
          if (iVar9 == 0) {
            out_n = (pnm_header *)&header_info.height;
          }
          else {
            iVar9 = bcmp(cmptparm,"DEPTH",6);
            if (iVar9 == 0) {
              out_n = (pnm_header *)&header_info.depth;
            }
            else {
              iVar9 = bcmp(cmptparm,"MAXVAL",7);
              if (iVar9 != 0) {
                iVar9 = bcmp(cmptparm,"TUPLTYPE",9);
                if (iVar9 == 0) {
                  start = (uchar *)skip_idf((char *)start,type);
                  if ((start == (uchar *)0x0) || (*start == '\0')) goto LAB_0010605b;
                  iVar9 = bcmp(type,"BLACKANDWHITE",0xe);
                  if (iVar9 == 0) {
                    header_info.bw = '\x01';
                    bVar6 = false;
                    goto LAB_00105c85;
                  }
                  iVar9 = bcmp(type,"GRAYSCALE",10);
                  if (iVar9 == 0) {
                    header_info.gray = '\x01';
                    bVar6 = false;
                    goto LAB_00105c85;
                  }
                  auVar28[0] = -(type[0] == 'G');
                  auVar28[1] = -(type[1] == 'R');
                  auVar28[2] = -(type[2] == 'A');
                  auVar28[3] = -(type[3] == 'Y');
                  auVar28[4] = -(type[4] == 'S');
                  auVar28[5] = -(type[5] == 'C');
                  auVar28[6] = -(type[6] == 'A');
                  auVar28[7] = -(type[7] == 'L');
                  auVar28[8] = -(type[8] == 'E');
                  auVar28[9] = -(type[9] == '_');
                  auVar28[10] = -(type[10] == 'A');
                  auVar28[0xb] = -(type[0xb] == 'L');
                  auVar28[0xc] = -(type[0xc] == 'P');
                  auVar28[0xd] = -(type[0xd] == 'H');
                  auVar28[0xe] = -(type[0xe] == 'A');
                  auVar28[0xf] = -(type[0xf] == '\0');
                  if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar28[0xf] >> 7) << 0xf) == 0xffff) {
                    header_info.graya = '\x01';
                    bVar6 = false;
                    goto LAB_00105c85;
                  }
                  if (type._0_4_ == 0x424752) {
                    header_info.rgb = '\x01';
                    bVar6 = false;
                    goto LAB_00105c85;
                  }
                  iVar9 = bcmp(type,"RGB_ALPHA",10);
                  if (iVar9 == 0) {
                    header_info.rgba = '\x01';
                    bVar6 = false;
                    goto LAB_00105c85;
                  }
                  pcVar13 = "read_pnm_header:unknown P7 TUPLTYPE %s\n";
                  poVar18 = (opj_image_cmptparm_t *)type;
                }
                else {
                  pcVar13 = "read_pnm_header:unknown P7 idf %s\n";
                  poVar18 = cmptparm;
                }
                uVar8 = fprintf(_stderr,pcVar13,poVar18);
                start = (uchar *)(ulong)uVar8;
                goto LAB_0010605b;
              }
              out_n = (pnm_header *)&header_info.maxval;
            }
          }
        }
        start = (uchar *)skip_int((char *)start,&out_n->width);
        if ((start == (uchar *)0x0) || (*start == '\0')) goto LAB_0010605b;
      } while( true );
    }
    uVar8 = fprintf(_stderr,"read_pnm_header:magic format %d invalid\n",(ulong)uVar8);
    start = (uchar *)(ulong)uVar8;
  }
LAB_0010605b:
  iVar19 = header_info.format;
  iVar12 = header_info.maxval;
  iVar22 = header_info.height;
  iVar9 = header_info.width;
  if (header_info.ok == '\0') {
LAB_00106412:
    fclose(__stream);
    return (opj_image_t *)0x0;
  }
  uVar4 = CONCAT44(header_info.height,header_info.width);
  auVar29._0_4_ = -(uint)(header_info.width == 0);
  auVar29._4_4_ = -(uint)(header_info.width == 0);
  auVar29._8_4_ = -(uint)(header_info.height == 0);
  auVar29._12_4_ = -(uint)(header_info.height == 0);
  iVar10 = movmskpd((int)start,auVar29);
  if ((iVar10 != 0) || (header_info.format == 7 && header_info.depth == 0)) goto LAB_00106412;
  if ((int)(0x7fffffff / (long)header_info.height) < header_info.width) {
    fprintf(_stderr,"pnmtoimage:Image %dx%d too big!\n",header_info.width);
    goto LAB_00106412;
  }
  if (7 < (uint)header_info.format) goto LAB_00106412;
  local_3a4 = 1;
  if ((0x36U >> (header_info.format & 0x1fU) & 1) == 0) {
    if ((0x48U >> (header_info.format & 0x1fU) & 1) == 0) {
      if (header_info.format != 7) goto LAB_00106412;
      cVar7 = (header_info.depth < 3) + '\x01';
      uVar8 = header_info.depth;
    }
    else {
      cVar7 = '\x01';
      uVar8 = 3;
    }
  }
  else {
    cVar7 = '\x02';
    uVar8 = 1;
  }
  if (1 < header_info.maxval) {
    if ((uint)header_info.maxval < 4) {
      local_3a4 = 2;
    }
    else if ((uint)header_info.maxval < 8) {
      local_3a4 = 3;
    }
    else if ((uint)header_info.maxval < 0x10) {
      local_3a4 = 4;
    }
    else if ((uint)header_info.maxval < 0x20) {
      local_3a4 = 5;
    }
    else if ((uint)header_info.maxval < 0x40) {
      local_3a4 = 6;
    }
    else if ((uint)header_info.maxval < 0x80) {
      local_3a4 = 7;
    }
    else {
      local_3a4 = 8;
      if (0xff < (uint)header_info.maxval) {
        if ((uint)header_info.maxval < 0x200) {
          local_3a4 = 9;
        }
        else if ((uint)header_info.maxval < 0x400) {
          local_3a4 = 10;
        }
        else if ((uint)header_info.maxval < 0x800) {
          local_3a4 = 0xb;
        }
        else if ((uint)header_info.maxval < 0x1000) {
          local_3a4 = 0xc;
        }
        else if ((uint)header_info.maxval < 0x2000) {
          local_3a4 = 0xd;
        }
        else if ((uint)header_info.maxval < 0x4000) {
          local_3a4 = 0xe;
        }
        else {
          local_3a4 = 0x10 - ((uint)header_info.maxval < 0x8000);
        }
      }
    }
  }
  uVar24 = 8;
  if (8 < local_3a4) {
    uVar24 = local_3a4;
  }
  uVar1._0_4_ = parameters->subsampling_dx;
  uVar1._4_4_ = parameters->subsampling_dy;
  lVar20 = 0;
  memset(cmptparm,0,(long)(int)uVar8 * 0x24);
  uVar25 = 0;
  if (0 < (int)uVar8) {
    uVar25 = (ulong)uVar8;
  }
  for (; uVar25 * 0x24 - lVar20 != 0; lVar20 = lVar20 + 0x24) {
    *(uint *)((long)&cmptparm[0].prec + lVar20) = uVar24;
    *(uint *)((long)&cmptparm[0].bpp + lVar20) = uVar24;
    *(undefined4 *)((long)&cmptparm[0].sgnd + lVar20) = 0;
    *(undefined8 *)((long)&cmptparm[0].dx + lVar20) = uVar1;
    *(undefined8 *)((long)&cmptparm[0].w + lVar20) = uVar4;
  }
  poVar14 = (opj_image_t *)opj_image_create(uVar8,cmptparm,cVar7);
  if (poVar14 == (opj_image_t *)0x0) goto LAB_00106412;
  OVar2 = parameters->image_offset_x0;
  poVar14->x0 = OVar2;
  OVar3 = parameters->image_offset_y0;
  poVar14->y0 = OVar3;
  poVar14->x1 = OVar2 + (undefined4)uVar1 * (iVar9 + -1) + 1;
  poVar14->y1 = uVar1._4_4_ * (iVar22 + -1) + OVar3 + 1;
  if ((iVar19 & 0xfffffffeU) == 2) {
    uVar8 = iVar22 * iVar9;
    if (iVar22 * iVar9 < 1) {
      uVar8 = 0;
    }
    for (uVar21 = 0; uVar21 != uVar8; uVar21 = uVar21 + 1) {
      for (lVar20 = 0; uVar25 * 0x40 != lVar20; lVar20 = lVar20 + 0x40) {
        type[0] = '\0';
        type[1] = '\0';
        type[2] = '\0';
        type[3] = '\0';
        iVar9 = __isoc99_fscanf(__stream,"%u",type);
        if (iVar9 != 1) {
          fwrite("Missing data. Quitting.\n",0x18,1,_stderr);
          opj_image_destroy(poVar14);
          goto LAB_00106412;
        }
        *(int *)(*(long *)((long)&poVar14->comps->data + lVar20) + uVar21 * 4) =
             (type._0_4_ * 0xff) / iVar12;
      }
    }
    goto LAB_00106430;
  }
  if (1 < iVar19 - 5U) {
    if (iVar19 != 7) {
      if (iVar19 == 1) {
        uVar8 = iVar22 * iVar9;
        if (iVar22 * iVar9 < 1) {
          uVar8 = 0;
        }
        for (uVar25 = 0; uVar8 != uVar25; uVar25 = uVar25 + 1) {
          iVar9 = __isoc99_fscanf(__stream,"%u",type);
          if (iVar9 != 1) goto LAB_001065be;
          OVar17 = 0;
          if (type._0_4_ == 0) {
            OVar17 = 0xff;
          }
          poVar14->comps->data[uVar25] = OVar17;
        }
      }
      else if (iVar19 == 4) {
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        if (iVar22 < 1) {
          iVar22 = 0;
        }
        iVar12 = iVar9;
        iVar19 = 0;
        for (iVar10 = 0; iVar10 != iVar22; iVar10 = iVar10 + 1) {
          iVar11 = 0;
          iVar16 = -1;
          for (lVar20 = (long)iVar19; iVar12 != lVar20; lVar20 = lVar20 + 1) {
            if (iVar16 == -1) {
              iVar11 = getc(__stream);
              iVar16 = 7;
              if (iVar11 == -1) {
                fwrite("Missing data. Quitting.\n",0x18,1,_stderr);
                goto LAB_001065df;
              }
            }
            OVar17 = 0;
            if ((byte)((byte)iVar11 & (byte)(1 << ((byte)iVar16 & 0x1f))) == 0) {
              OVar17 = 0xff;
            }
            poVar14->comps->data[lVar20] = OVar17;
            iVar16 = iVar16 + -1;
          }
          iVar12 = iVar12 + iVar9;
          iVar19 = iVar9 + iVar19;
        }
      }
      goto LAB_00106430;
    }
    if (CONCAT13(header_info.graya,
                 CONCAT12(header_info.gray,CONCAT11(header_info.rgba,header_info.rgb))) == 0) {
      if (header_info.bw != '\0') {
        uVar21 = 0;
        uVar25 = (ulong)(uint)(iVar22 * iVar9);
        if (iVar22 * iVar9 < 1) {
          uVar25 = uVar21;
        }
        for (; uVar25 != uVar21; uVar21 = uVar21 + 1) {
          sVar15 = fread(type,1,1,__stream);
          if (sVar15 == 0) goto LAB_001065be;
          OVar17 = 0;
          if ((type._0_4_ & 1) == 0) {
            OVar17 = 0xff;
          }
          poVar14->comps->data[uVar21] = OVar17;
        }
      }
      goto LAB_00106430;
    }
  }
  uVar23 = 0;
  uVar21 = (ulong)(uint)(iVar22 * iVar9);
  if (iVar22 * iVar9 < 1) {
    uVar21 = uVar23;
  }
  for (; uVar23 != uVar21; uVar23 = uVar23 + 1) {
    for (lVar20 = 0; uVar25 * 0x40 != lVar20; lVar20 = lVar20 + 0x40) {
      sVar15 = fread(type,1,1,__stream);
      if (sVar15 == 0) goto LAB_001065be;
      if (local_3a4 < 9) {
        uVar8 = type._0_4_ & 0xff;
      }
      else {
        sVar15 = fread(&c1,1,1,__stream);
        if (sVar15 == 0) goto LAB_001065be;
        uVar8 = (uint)CONCAT11(type[0],c1);
      }
      *(uint *)(*(long *)((long)&poVar14->comps->data + lVar20) + uVar23 * 4) = uVar8;
    }
  }
LAB_00106430:
  fclose(__stream);
  return poVar14;
LAB_001065be:
  fwrite("Missing data. Quitting.\n",0x18,1,_stderr);
LAB_001065df:
  opj_image_destroy(poVar14);
  goto LAB_00106412;
}

Assistant:

opj_image_t* pnmtoimage(const char *filename, opj_cparameters_t *parameters)
{
    int subsampling_dx = parameters->subsampling_dx;
    int subsampling_dy = parameters->subsampling_dy;

    FILE *fp = NULL;
    int i, compno, numcomps, w, h, prec, format;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t cmptparm[4]; /* RGBA: max. 4 components */
    opj_image_t * image = NULL;
    struct pnm_header header_info;

    if ((fp = fopen(filename, "rb")) == NULL) {
        fprintf(stderr, "pnmtoimage:Failed to open %s for reading!\n", filename);
        return NULL;
    }
    memset(&header_info, 0, sizeof(struct pnm_header));

    read_pnm_header(fp, &header_info);

    if (!header_info.ok) {
        fclose(fp);
        return NULL;
    }

    if (header_info.width == 0
            || header_info.height == 0
            || (header_info.format == 7 && header_info.depth == 0)) {
        fclose(fp);
        return NULL;
    }

    /* This limitation could be removed by making sure to use size_t below */
    if (header_info.height != 0 &&
            header_info.width > INT_MAX / header_info.height) {
        fprintf(stderr, "pnmtoimage:Image %dx%d too big!\n",
                header_info.width, header_info.height);
        fclose(fp);
        return NULL;
    }

    format = header_info.format;

    switch (format) {
    case 1: /* ascii bitmap */
    case 4: /* raw bitmap */
        numcomps = 1;
        break;

    case 2: /* ascii greymap */
    case 5: /* raw greymap */
        numcomps = 1;
        break;

    case 3: /* ascii pixmap */
    case 6: /* raw pixmap */
        numcomps = 3;
        break;

    case 7: /* arbitrary map */
        numcomps = header_info.depth;
        break;

    default:
        fclose(fp);
        return NULL;
    }
    if (numcomps < 3) {
        color_space = OPJ_CLRSPC_GRAY;    /* GRAY, GRAYA */
    } else {
        color_space = OPJ_CLRSPC_SRGB;    /* RGB, RGBA */
    }

    prec = has_prec(header_info.maxval);

    if (prec < 8) {
        prec = 8;
    }

    w = header_info.width;
    h = header_info.height;
    subsampling_dx = parameters->subsampling_dx;
    subsampling_dy = parameters->subsampling_dy;

    memset(&cmptparm[0], 0, (size_t)numcomps * sizeof(opj_image_cmptparm_t));

    for (i = 0; i < numcomps; i++) {
        cmptparm[i].prec = (OPJ_UINT32)prec;
        cmptparm[i].bpp = (OPJ_UINT32)prec;
        cmptparm[i].sgnd = 0;
        cmptparm[i].dx = (OPJ_UINT32)subsampling_dx;
        cmptparm[i].dy = (OPJ_UINT32)subsampling_dy;
        cmptparm[i].w = (OPJ_UINT32)w;
        cmptparm[i].h = (OPJ_UINT32)h;
    }
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm[0], color_space);

    if (!image) {
        fclose(fp);
        return NULL;
    }

    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = (OPJ_UINT32)(parameters->image_offset_x0 + (w - 1) * subsampling_dx
                             + 1);
    image->y1 = (OPJ_UINT32)(parameters->image_offset_y0 + (h - 1) * subsampling_dy
                             + 1);

    if ((format == 2) || (format == 3)) { /* ascii pixmap */
        unsigned int index;

        for (i = 0; i < w * h; i++) {
            for (compno = 0; compno < numcomps; compno++) {
                index = 0;
                if (fscanf(fp, "%u", &index) != 1) {
                    fprintf(stderr, "Missing data. Quitting.\n");
                    opj_image_destroy(image);
                    fclose(fp);
                    return NULL;
                }

                image->comps[compno].data[i] = (OPJ_INT32)(index * 255) / header_info.maxval;
            }
        }
    } else if ((format == 5)
               || (format == 6)
               || ((format == 7)
                   && (header_info.gray || header_info.graya
                       || header_info.rgb || header_info.rgba))) { /* binary pixmap */
        unsigned char c0, c1, one;

        one = (prec < 9);

        for (i = 0; i < w * h; i++) {
            for (compno = 0; compno < numcomps; compno++) {
                if (!fread(&c0, 1, 1, fp)) {
                    fprintf(stderr, "Missing data. Quitting.\n");
                    opj_image_destroy(image);
                    fclose(fp);
                    return NULL;
                }
                if (one) {
                    image->comps[compno].data[i] = c0;
                } else {
                    if (!fread(&c1, 1, 1, fp)) {
                        fprintf(stderr, "Missing data. Quitting.\n");
                        opj_image_destroy(image);
                        fclose(fp);
                        return NULL;
                    }
                    /* netpbm: */
                    image->comps[compno].data[i] = ((c0 << 8) | c1);
                }
            }
        }
    } else if (format == 1) { /* ascii bitmap */
        for (i = 0; i < w * h; i++) {
            unsigned int index;

            if (fscanf(fp, "%u", &index) != 1) {
                fprintf(stderr, "Missing data. Quitting.\n");
                opj_image_destroy(image);
                fclose(fp);
                return NULL;
            }

            image->comps[0].data[i] = (index ? 0 : 255);
        }
    } else if (format == 4) {
        int x, y, bit;
        int uc;

        i = 0;
        for (y = 0; y < h; ++y) {
            bit = -1;
            uc = 0;

            for (x = 0; x < w; ++x) {
                if (bit == -1) {
                    bit = 7;
                    uc = getc(fp);
                    if (uc == EOF) {
                        fprintf(stderr, "Missing data. Quitting.\n");
                        opj_image_destroy(image);
                        fclose(fp);
                        return NULL;
                    }
                }
                image->comps[0].data[i] = ((((unsigned char)uc >> bit) & 1) ? 0 : 255);
                --bit;
                ++i;
            }
        }
    } else if ((format == 7 && header_info.bw)) { /*MONO*/
        unsigned char uc;

        for (i = 0; i < w * h; ++i) {
            if (!fread(&uc, 1, 1, fp)) {
                fprintf(stderr, "Missing data. Quitting.\n");
                opj_image_destroy(image);
                fclose(fp);
                return NULL;
            }
            image->comps[0].data[i] = (uc & 1) ? 0 : 255;
        }
    }
    fclose(fp);

    return image;
}